

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_basic_string_only<toml::type_config>
            (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  error_info *__str;
  error_type *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  error_info *v;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  *v_00;
  _Alloc_hider this_00;
  string str;
  string_type val;
  string local_370;
  string local_350;
  location loc2;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  esc;
  region reg;
  location local_1f8;
  location first;
  error_info local_168;
  error_info local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  local_b8;
  
  location::location(&first,loc);
  syntax::basic_string((sequence *)&esc,&ctx->toml_spec_);
  sequence::scan(&reg,(sequence *)&esc,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &esc.field_1.succ_);
  if (reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"toml::parse_basic_string: invalid string format",
               (allocator<char> *)&str);
    syntax::basic_string((sequence *)&loc2,&ctx->toml_spec_);
    location::location(&local_1f8,loc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"",(allocator<char> *)&val);
    make_syntax_error<toml::detail::sequence>
              ((error_info *)&esc,&local_350,(sequence *)&loc2,&local_1f8,&local_370);
    err<toml::error_info>((failure<toml::error_info> *)&local_110,(error_info *)&esc);
    result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
    ::result(__return_storage_ptr__,(failure_type *)&local_110);
    error_info::~error_info(&local_110);
    error_info::~error_info((error_info *)&esc);
    std::__cxx11::string::~string((string *)&local_370);
    location::~location(&local_1f8);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&loc2.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
    std::__cxx11::string::~string((string *)&local_350);
  }
  else {
    region::as_string_abi_cxx11_(&str,&reg);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,0,1);
    val._M_dataplus._M_p = (pointer)&val.field_2;
    val._M_string_length = 0;
    val.field_2._M_local_buf[0] = '\0';
    this_00 = str._M_dataplus;
    do {
      while( true ) {
        if (this_00._M_p == str._M_dataplus._M_p + str._M_string_length) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_toml::detail::region_&,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                      *)&esc,&val,&reg);
          ok<std::pair<std::__cxx11::string,toml::detail::region>>
                    ((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                      *)&local_b8,(toml *)&esc,v_00);
          result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
          ::result(__return_storage_ptr__,(success_type *)&local_b8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
          ::~pair(&local_b8);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                   *)&esc);
          goto LAB_0032f253;
        }
        if ((detail)*this_00._M_p == (detail)0x5c) break;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                  *this_00._M_p);
        this_00._M_p = this_00._M_p + 1;
      }
      make_string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&esc,(detail *)this_00._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(str._M_dataplus._M_p + str._M_string_length),in_RCX);
      make_temporary_location(&loc2,(string *)&esc);
      std::__cxx11::string::~string((string *)&esc);
      parse_escape_sequence<toml::type_config>(&esc,&loc2,ctx);
      bVar1 = esc.is_ok_;
      if (esc.is_ok_ == false) {
        this = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
               ::unwrap_err(&esc,(source_location)0x4e9018);
        err<toml::error_info&>((failure<toml::error_info> *)&local_168,(toml *)this,v);
        __str = &local_168;
        result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
        ::result(__return_storage_ptr__,(failure_type *)&local_168);
        error_info::~error_info(&local_168);
      }
      else {
        __str = (error_info *)
                result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                ::unwrap(&esc,(source_location)0x4e9030);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
        this_00._M_p = this_00._M_p + loc2.location_;
      }
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
      ::cleanup(&esc,(EVP_PKEY_CTX *)__str);
      location::~location(&loc2);
    } while (bVar1 != false);
LAB_0032f253:
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&str);
  }
  region::~region(&reg);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<typename basic_value<TC>::string_type, region>, error_info>
parse_basic_string_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    auto reg = syntax::basic_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_basic_string: "
            "invalid string format",
            syntax::basic_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    assert(str.back() == '\"');
    str.pop_back();
    assert(str.at(0) == '\"');
    str.erase(0, 1);

    using string_type = typename basic_value<TC>::string_type;
    using char_type   = typename string_type::value_type;
    string_type val;

    {
        auto iter = str.begin();
        while(iter != str.end())
        {
            if(*iter == '\\')
            {
                auto loc2 = make_temporary_location(make_string(iter, str.end()));

                auto esc = parse_escape_sequence(loc2, ctx);

                // syntax does not check its value. the unicode codepoint may be
                // invalid, e.g. out-of-bound, [0xD800, 0xDFFF]
                if(esc.is_err())
                {
                    return err(esc.unwrap_err());
                }

                val += esc.unwrap();
                std::advance(iter, loc2.get_location());
            }
            else
            {
                val += char_type(*iter); // we already checked the syntax.
                ++iter;
            }
        }
    }
    return ok(std::make_pair(val, reg));
}